

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

int __thiscall AliHttpRequest::ParseUrl(AliHttpRequest *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  allocator<char> local_61;
  http_parser_url parser_url;
  key_type local_40;
  
  iVar2 = http_parser_parse_url_
                    ((this->url_)._M_dataplus._M_p,(this->url_)._M_string_length,0,&parser_url);
  if (iVar2 == 0) {
    if ((parser_url.field_set & 8) != 0) {
      std::__cxx11::string::resize((ulong)&this->path_);
      strncpy((this->path_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[3].off,
              (ulong)parser_url.field_data[3].len);
    }
    if ((parser_url.field_set & 1) != 0) {
      std::__cxx11::string::resize((ulong)&this->sechema_);
      strncpy((this->sechema_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[0].off,
              (ulong)parser_url.field_data[0].len);
    }
    if ((parser_url.field_set & 2) != 0) {
      std::__cxx11::string::resize((ulong)&this->host_);
      strncpy((this->host_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[1].off,
              (ulong)parser_url.field_data[1].len);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Host",&local_61);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->map_request_headers_,&local_40);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((parser_url.field_set & 0x10) != 0) {
      std::__cxx11::string::resize((ulong)&this->query_);
      strncpy((this->query_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[4].off,
              (ulong)parser_url.field_data[4].len);
    }
    if ((parser_url.field_set & 0x20) != 0) {
      std::__cxx11::string::resize((ulong)&this->flagment_);
      strncpy((this->flagment_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[5].off,
              (ulong)parser_url.field_data[5].len);
    }
    if ((parser_url.field_set & 4) == 0) {
      bVar1 = std::operator==(&this->sechema_,"https");
      iVar2 = 0;
      if (bVar1) {
        std::__cxx11::string::assign((char *)&this->port_);
        this->is_tls = true;
        iVar2 = 0;
      }
    }
    else {
      std::__cxx11::string::resize((ulong)&this->port_);
      strncpy((this->port_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + parser_url.field_data[2].off,
              (ulong)parser_url.field_data[2].len);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int AliHttpRequest::ParseUrl() {
  http_parser_url parser_url;
  if(http_parser_parse_url_(url_.c_str(), url_.size(), false, &parser_url) != 0) {
    return -1;
  }
  if(parser_url.field_set &  (1 << UF_PATH)) {
    int len = parser_url.field_data[UF_PATH].len;
    path_.resize(len);
    strncpy((char*)path_.c_str(), url_.c_str() + parser_url.field_data[UF_PATH].off, len);
  }

  if(parser_url.field_set &  (1 << UF_SCHEMA)) {
    int len = parser_url.field_data[UF_SCHEMA].len;
    sechema_.resize(len);
    strncpy((char*)sechema_.c_str(), url_.c_str() + parser_url.field_data[UF_SCHEMA].off, len);
  }

  if(parser_url.field_set & (1 << UF_HOST)) {
    int len = parser_url.field_data[UF_HOST].len;
    host_.resize(len);
    strncpy((char*)host_.c_str(), url_.c_str() + parser_url.field_data[UF_HOST].off, len);
    this->map_request_headers_["Host"] = host_;
  }

  if(parser_url.field_set & (1 << UF_QUERY)) {
    int len = parser_url.field_data[UF_QUERY].len;
    query_.resize(len);
    strncpy((char*)query_.c_str(), url_.c_str() + parser_url.field_data[UF_QUERY].off, len);
  }

  if(parser_url.field_set & (1 << UF_FRAGMENT)) {
    int len = parser_url.field_data[UF_FRAGMENT].len;
    flagment_.resize(len);
    strncpy((char*)flagment_.c_str(), url_.c_str() + parser_url.field_data[UF_FRAGMENT].off, len);
  }

  if(parser_url.field_set & (1 << UF_PORT)) {
    int len = parser_url.field_data[UF_PORT].len;
    port_.resize(len);
    strncpy((char*)port_.c_str(), url_.c_str() + parser_url.field_data[UF_PORT].off, len);
  } else if(sechema_ == "https") {
    port_ = "443";
    this->is_tls = true;
  }

  return 0;
}